

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

int __thiscall
helics::NetworkCommsInterface::PortAllocator::findOpenPort
          (PortAllocator *this,int count,string_view host)

{
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *this_00;
  mapped_type mVar1;
  PortAllocator *this_01;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  undefined4 in_register_00000034;
  int iVar10;
  int port;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view local_50;
  undefined8 local_40;
  PortAllocator *local_38;
  
  local_40 = CONCAT44(in_register_00000034,count);
  pcVar2 = host._M_str;
  sVar3 = host._M_len;
  local_38 = this;
  do {
    do {
      sVar8 = sVar3;
      pcVar7 = pcVar2;
      __y._M_str = "127.0.0.1";
      __y._M_len = 9;
      __x._M_str = pcVar7;
      __x._M_len = sVar8;
      bVar4 = std::operator==(__x,__y);
      pcVar2 = "localhost";
      sVar3 = 9;
    } while (bVar4);
    __y_00._M_str = "::1";
    __y_00._M_len = 3;
    __x_00._M_str = pcVar7;
    __x_00._M_len = sVar8;
    bVar4 = std::operator==(__x_00,__y_00);
    this_01 = local_38;
    pcVar2 = "localhost";
  } while (bVar4);
  local_50._M_str = pcVar7;
  local_50._M_len = sVar8;
  this_00 = &local_38->nextPorts;
  iVar5 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&this_00->_M_t,&local_50);
  if ((_Rb_tree_header *)iVar5._M_node == &(this_01->nextPorts)._M_t._M_impl.super__Rb_tree_header)
  {
    port = this_01->startingPort;
    local_50 = addNewHost(this_01,local_50);
    mVar1 = this_01->startingPort;
    pmVar6 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,&local_50);
    *pmVar6 = mVar1;
    pmVar6 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,&local_50);
    iVar10 = (int)local_40;
    *pmVar6 = *pmVar6 + iVar10;
  }
  else {
    port = *(int *)&iVar5._M_node[1]._M_left;
    iVar10 = (int)local_40;
    *(int *)&iVar5._M_node[1]._M_left = port + iVar10;
  }
  bVar4 = isPortUsed(this_01,local_50,port);
  if (bVar4) {
    do {
      port = port + 1;
      bVar4 = isPortUsed(this_01,local_50,port);
    } while (bVar4);
    pmVar6 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,&local_50);
    *pmVar6 = iVar10 + port;
  }
  iVar9 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
    iVar9 = 0;
  }
  for (; iVar10 != iVar9; iVar9 = iVar9 + 1) {
    addUsedPort(this_01,local_50,port + iVar9);
  }
  return port;
}

Assistant:

int NetworkCommsInterface::PortAllocator::findOpenPort(int count, std::string_view host)
{
    if ((host == "127.0.0.1") || (host == "::1")) {
        return findOpenPort(count, localHostString);
    }
    auto np = nextPorts.find(host);
    int nextPort = startingPort;
    if (np == nextPorts.end()) {
        host = addNewHost(host);
        nextPorts[host] = startingPort;
        nextPorts[host] += count;
    } else {
        nextPort = np->second;
        (np->second) += count;
    }
    if (isPortUsed(host, nextPort)) {
        ++nextPort;
        while (isPortUsed(host, nextPort)) {
            ++nextPort;
        }
        nextPorts[host] = nextPort + count;
    }
    for (int ii = 0; ii < count; ++ii) {
        addUsedPort(host, nextPort + ii);
    }
    return nextPort;
}